

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

int32_t icu_63::calcNameSetLength
                  (uint16_t *tokens,uint16_t tokenCount,uint8_t *tokenStrings,int8_t *tokenLengths,
                  uint32_t *set,uint8_t **pLine,uint8_t *lineLimit)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  uint8_t **ppuVar5;
  uint8_t **ppuVar6;
  int iVar7;
  char *s;
  
  ppuVar5 = *(uint8_t ***)set;
  iVar7 = 0;
  while (ppuVar6 = ppuVar5, ppuVar5 != pLine) {
    ppuVar6 = (uint8_t **)((long)ppuVar5 + 1);
    bVar1 = *(byte *)ppuVar5;
    uVar4 = (ulong)bVar1;
    if (bVar1 == 0x3b) break;
    if (bVar1 < tokenCount) {
      uVar2 = tokens[(ushort)bVar1];
      if (uVar2 == 0xfffe) {
        uVar4 = (ulong)CONCAT11(bVar1,*(byte *)((long)ppuVar5 + 1));
        uVar2 = tokens[uVar4];
        ppuVar6 = (uint8_t **)((long)ppuVar5 + 2);
      }
      ppuVar5 = ppuVar6;
      s = (char *)(ulong)uVar2;
      if (uVar2 == 0xffff) {
        *(uint *)(gNameSet + ((uint)(uVar4 >> 3) & 0x1c)) =
             *(uint *)(gNameSet + ((uint)(uVar4 >> 3) & 0x1c)) | 1 << ((byte)uVar4 & 0x1f);
        goto LAB_0019ba05;
      }
      if (tokenLengths == (int8_t *)0x0) {
        iVar3 = calcStringSetLength((uint32_t *)(s + (long)tokenStrings),s);
      }
      else {
        iVar3 = (int)tokenLengths[uVar4];
        if (tokenLengths[uVar4] == '\0') {
          iVar3 = calcStringSetLength((uint32_t *)(s + (long)tokenStrings),s);
          tokenLengths[uVar4] = (int8_t)iVar3;
        }
      }
      iVar7 = iVar7 + iVar3;
    }
    else {
      *(uint *)(gNameSet + (ulong)(bVar1 >> 5) * 4) =
           *(uint *)(gNameSet + (ulong)(bVar1 >> 5) * 4) | 1 << (bVar1 & 0x1f);
      ppuVar5 = ppuVar6;
LAB_0019ba05:
      iVar7 = iVar7 + 1;
    }
  }
  *(uint8_t ***)set = ppuVar6;
  return iVar7;
}

Assistant:

static int32_t
calcNameSetLength(const uint16_t *tokens, uint16_t tokenCount, const uint8_t *tokenStrings, int8_t *tokenLengths,
                  uint32_t set[8],
                  const uint8_t **pLine, const uint8_t *lineLimit) {
    const uint8_t *line=*pLine;
    int32_t length=0, tokenLength;
    uint16_t c, token;

    while(line!=lineLimit && (c=*line++)!=(uint8_t)';') {
        if(c>=tokenCount) {
            /* implicit letter */
            SET_ADD(set, c);
            ++length;
        } else {
            token=tokens[c];
            if(token==(uint16_t)(-2)) {
                /* this is a lead byte for a double-byte token */
                c=c<<8|*line++;
                token=tokens[c];
            }
            if(token==(uint16_t)(-1)) {
                /* explicit letter */
                SET_ADD(set, c);
                ++length;
            } else {
                /* count token word */
                if(tokenLengths!=NULL) {
                    /* use cached token length */
                    tokenLength=tokenLengths[c];
                    if(tokenLength==0) {
                        tokenLength=calcStringSetLength(set, (const char *)tokenStrings+token);
                        tokenLengths[c]=(int8_t)tokenLength;
                    }
                } else {
                    tokenLength=calcStringSetLength(set, (const char *)tokenStrings+token);
                }
                length+=tokenLength;
            }
        }
    }

    *pLine=line;
    return length;
}